

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilMisc.c
# Opt level: O3

uint ** Extra_TruthPerm54(void)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  uint uVar3;
  uint **ppuVar4;
  uint **ppuVar5;
  long lVar6;
  uint uTruth;
  long lVar7;
  long lVar8;
  undefined1 auVar9 [16];
  
  ppuVar4 = (uint **)malloc(0x180000);
  ppuVar5 = ppuVar4 + 0x10000;
  *ppuVar4 = (uint *)ppuVar5;
  auVar2 = _DAT_0093d220;
  auVar1 = _DAT_0093d210;
  lVar7 = 1;
  lVar8 = 2;
  lVar6 = 0;
  do {
    auVar9._8_4_ = (int)lVar6;
    auVar9._0_8_ = lVar6;
    auVar9._12_4_ = (int)((ulong)lVar6 >> 0x20);
    auVar9 = (auVar9 | auVar1) ^ auVar2;
    if (auVar9._4_4_ == -0x80000000 && auVar9._0_4_ < -0x7fff0001) {
      ppuVar4[lVar6 + 1] = (uint *)(ppuVar5 + lVar7 * 2);
      ppuVar4[lVar6 + 2] = (uint *)(ppuVar5 + lVar8 * 2);
    }
    lVar6 = lVar6 + 2;
    lVar7 = lVar7 + 2;
    lVar8 = lVar8 + 2;
  } while (lVar6 != 0x10000);
  uTruth = 0;
  lVar6 = 0;
  do {
    uVar3 = Extra_TruthPerm5One(uTruth,0x17);
    *ppuVar4[lVar6] = uVar3;
    uVar3 = Extra_TruthPerm5One(uTruth,0x1b);
    ppuVar4[lVar6][1] = uVar3;
    uVar3 = Extra_TruthPerm5One(uTruth,0x1d);
    ppuVar4[lVar6][2] = uVar3;
    uVar3 = Extra_TruthPerm5One(uTruth,0x1e);
    ppuVar4[lVar6][3] = uVar3;
    lVar6 = lVar6 + 1;
    uTruth = uTruth + 0x10001;
  } while (lVar6 != 0x10000);
  return ppuVar4;
}

Assistant:

void ** Extra_ArrayAlloc( int nCols, int nRows, int Size )
{
    void ** pRes;
    char * pBuffer;
    int i;
    assert( nCols > 0 && nRows > 0 && Size > 0 );
    pBuffer = ABC_ALLOC( char, nCols * (sizeof(void *) + nRows * Size) );
    pRes = (void **)pBuffer;
    pRes[0] = pBuffer + nCols * sizeof(void *);
    for ( i = 1; i < nCols; i++ )
        pRes[i] = (void *)((char *)pRes[0] + i * nRows * Size);
    return pRes;
}